

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_url.c
# Opt level: O2

char find_delim(char **pp,int colon_and_at_sign_are_delims)

{
  byte bVar1;
  int iVar2;
  undefined8 in_RAX;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  int chars;
  uint val;
  undefined8 local_38;
  
  pbVar4 = (byte *)*pp;
  pbVar5 = pbVar4;
  local_38 = in_RAX;
  do {
    pbVar6 = pbVar5 + 1;
    bVar1 = *pbVar5;
    uVar3 = (ulong)(bVar1 - 0x23);
    if (bVar1 - 0x23 < 0x3b) {
      if ((0x20800000UL >> (uVar3 & 0x3f) & 1) != 0) {
        if (colon_and_at_sign_are_delims == 0) goto LAB_0010b360;
        goto LAB_0010b36c;
      }
      if (uVar3 != 2) {
        if ((0x500000010001001U >> (uVar3 & 0x3f) & 1) == 0) goto LAB_0010b35c;
LAB_0010b36c:
        *pbVar4 = 0;
        *pp = (char *)pbVar6;
        return bVar1;
      }
      iVar2 = __isoc99_sscanf(pbVar6,"%2x%n",(long)&local_38 + 4,&local_38);
      if (iVar2 < 1) {
        return bVar1;
      }
      if ((int)local_38 != 2) {
        return bVar1;
      }
      *pbVar4 = local_38._4_1_;
      pbVar6 = pbVar5 + 3;
    }
    else {
LAB_0010b35c:
      if (bVar1 == 0) goto LAB_0010b36c;
LAB_0010b360:
      *pbVar4 = bVar1;
    }
    pbVar4 = pbVar4 + 1;
    pbVar5 = pbVar6;
  } while( true );
}

Assistant:

static char find_delim(char **pp, int colon_and_at_sign_are_delims)
{
  char *from = *pp;
  char *to = from;

  for (;;) {
    char ch = *from++;

    switch (ch) {
    case ':':
    case '@':
      if (!colon_and_at_sign_are_delims) {
        *to++ = ch;
        break;
      }

      /* fall through */
    case 0:
    case '/':
    case '?':
    case '#':
    case '[':
    case ']':
      *to = 0;
      *pp = from;
      return ch;

    case '%': {
      unsigned int val;
      int chars;
      int res = sscanf(from, "%2x%n", &val, &chars);

      if (res == EOF || res < 1 || chars != 2)
        /* Return a surprising delimiter to
           force an error. */
      {
        return '%';
      }

      *to++ = val;
      from += 2;
      break;
    }

    default:
      *to++ = ch;
      break;
    }
  }
}